

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

int countSkin(atom *src,atom *scratch,pointSet *dots)

{
  atom_t **ppaVar1;
  point3d *ppVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  atom_t *paVar6;
  pointSet *ppVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  point3d dotloc;
  point3d dotvect;
  vector3d local_60;
  vector3d local_48;
  
  uVar3 = src->elem;
  iVar4 = 0;
  if ((uVar3 | 4) != 5) {
    ppVar7 = dots + (int)uVar3;
    if ((uVar3 == 6) && (iVar4 = isCarbonylAtom(src), iVar4 != 0)) {
      ppVar7 = &COdots;
    }
    iVar4 = 0;
    if (0 < ppVar7->n) {
      lVar8 = 0;
      iVar4 = 0;
      do {
        local_48.z = ppVar7->p[lVar8].z;
        ppVar2 = ppVar7->p + lVar8;
        local_48.x = ppVar2->x;
        local_48.y = ppVar2->y;
        v3add(&src->loc,&local_48,&local_60);
        iVar5 = 1;
        paVar6 = scratch;
        if (scratch != (atom *)0x0) {
          do {
            if ((((paVar6->elem != 1) && (paVar6->elem != 5)) && (paVar6->mark != 0)) &&
               (dVar9 = local_60.x - (paVar6->loc).x, dVar10 = local_60.y - (paVar6->loc).y,
               dVar11 = local_60.z - (paVar6->loc).z,
               dVar11 * dVar11 + dVar9 * dVar9 + dVar10 * dVar10 <=
               (double)(paVar6->radius * paVar6->radius))) {
              iVar5 = 0;
              break;
            }
            ppaVar1 = &paVar6->scratch;
            paVar6 = *ppaVar1;
          } while (*ppaVar1 != (atom_t *)0x0);
        }
        iVar4 = iVar4 + iVar5;
        lVar8 = lVar8 + 1;
      } while (lVar8 < ppVar7->n);
    }
  }
  return iVar4;
}

Assistant:

int countSkin(atom *src, atom *scratch, pointSet dots[])
{
   atom *targ = NULL;
   int i = 0, within = 0, ok = 0;
   point3d dotloc, dotvect;
   pointSet *srcDots;
   int dotCnt = 0;

   if (src->elem == ignoreAtom
    || src->elem == atomHOd)   { return 0; } /*hb-only-dummy, phantom H atom*/

   srcDots = &(dots[src->elem]);
   if (src->elem == atomC && isCarbonylAtom(src)) {
      srcDots = &COdots;
   }

   for(i=0; i < srcDots->n; i++) {
      dotvect = srcDots->p[i];

      v3add(&(src->loc), &dotvect, &dotloc);

      ok = TRUE;

      /*targ is an atom*, scratch is an atom*,  atom* defined in abin.h */
      /* atom* scratch is a member of atom*: which has member scratch...*/
      /* so for-loop moves through all these atoms while an atom has a scratch*/

      for(targ = scratch; targ; targ = targ->scratch) {
	 if (targ->elem == ignoreAtom) {continue;}

	 /* eliminate if within bonded atom! */
	 if (targ->mark && (targ->elem != atomHOd)) {
#ifdef INLINE_FOR_SPEED
	    within = INRANGEINLINE(dotloc, (targ->loc), targ->radius);
#else
	    within = inRange(&dotloc, &(targ->loc), targ->radius);
#endif

	    if (within) { ok = FALSE; break; }
	 }
      }
      if (ok) { dotCnt++; }
   }
   return dotCnt;
}